

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GaussianPuffRecord.cpp
# Opt level: O3

KString * __thiscall
KDIS::DATA_TYPE::GaussianPuffRecord::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,GaussianPuffRecord *this)

{
  ostream *poVar1;
  KStringStream ss;
  KString local_2a0;
  KString local_280;
  KString local_260;
  KString local_240;
  KString local_220;
  KString local_200;
  KString local_1e0;
  KString local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  EnvironmentRecord::GetAsString_abi_cxx11_(&local_1c0,&this->super_EnvironmentRecord);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_190,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\tPuff Location:        ",0x17);
  WorldCoordinates::GetAsString_abi_cxx11_(&local_1e0,&this->m_PuffLocation);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\tOrigination Location: ",0x17);
  WorldCoordinates::GetAsString_abi_cxx11_(&local_200,&this->m_OrigLocation);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_200._M_dataplus._M_p,local_200._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\tSigma:                ",0x17);
  Vector::GetAsString_abi_cxx11_(&local_220,&this->m_Sigma);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_220._M_dataplus._M_p,local_220._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\td(Sigma)/dt:          ",0x17);
  Vector::GetAsString_abi_cxx11_(&local_240,&this->m_DDTSigma);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_240._M_dataplus._M_p,local_240._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\tOrientation:          ",0x17);
  EulerAngles::GetAsString_abi_cxx11_(&local_260,&this->m_Ori);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_260._M_dataplus._M_p,local_260._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\tVelocity:             ",0x17);
  Vector::GetAsString_abi_cxx11_(&local_280,&this->m_Velocity);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_280._M_dataplus._M_p,local_280._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\tAngualr Velocity:     ",0x17);
  Vector::GetAsString_abi_cxx11_(&local_2a0,&this->m_AngularVelocity);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_2a0._M_dataplus._M_p,local_2a0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\tCentroid Height:      ",0x17);
  poVar1 = std::ostream::_M_insert<double>((double)(float)this->m_f32CentHeight);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
    operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != &local_280.field_2) {
    operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._M_dataplus._M_p != &local_260.field_2) {
    operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240._M_dataplus._M_p != &local_240.field_2) {
    operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

KString GaussianPuffRecord::GetAsString() const
{
    KStringStream ss;

    ss << EnvironmentRecord::GetAsString()
       << "\tPuff Location:        " << m_PuffLocation.GetAsString()
       << "\tOrigination Location: " << m_OrigLocation.GetAsString()
       << "\tSigma:                " << m_Sigma.GetAsString()
       << "\td(Sigma)/dt:          " << m_DDTSigma.GetAsString()
       << "\tOrientation:          " << m_Ori.GetAsString()
       << "\tVelocity:             " << m_Velocity.GetAsString()
       << "\tAngualr Velocity:     " << m_AngularVelocity.GetAsString()
       << "\tCentroid Height:      " << m_f32CentHeight << "\n";

    return ss.str();
}